

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

int lex_scan(lex_t *lex,json_error_t *error)

{
  int iVar1;
  char *__s1;
  bool bVar2;
  bool local_2b;
  char *saved_text;
  int c;
  json_error_t *error_local;
  lex_t *lex_local;
  
  strbuffer_clear(&lex->saved_text);
  if (lex->token == 0x100) {
    lex_free_string(lex);
  }
  do {
    iVar1 = lex_get(lex,error);
    bVar2 = true;
    if (((iVar1 != 0x20) && (bVar2 = true, iVar1 != 9)) && (bVar2 = true, iVar1 != 10)) {
      bVar2 = iVar1 == 0xd;
    }
  } while (bVar2);
  if (iVar1 == -1) {
    lex->token = 0;
  }
  else if (iVar1 == -2) {
    lex->token = -1;
  }
  else {
    lex_save(lex,iVar1);
    if ((((iVar1 == 0x7b) || (iVar1 == 0x7d)) ||
        ((iVar1 == 0x5b || ((iVar1 == 0x5d || (iVar1 == 0x3a)))))) || (iVar1 == 0x2c)) {
      lex->token = iVar1;
    }
    else if (iVar1 == 0x22) {
      lex_scan_string(lex,error);
    }
    else if (((iVar1 < 0x30) || (0x39 < iVar1)) && (iVar1 != 0x2d)) {
      if (((iVar1 < 0x41) || (0x5a < iVar1)) && ((iVar1 < 0x61 || (0x7a < iVar1)))) {
        lex_save_cached(lex);
        lex->token = -1;
      }
      else {
        do {
          iVar1 = lex_get_save(lex,error);
          if ((iVar1 < 0x41) || (local_2b = true, 0x5a < iVar1)) {
            local_2b = 0x60 < iVar1 && iVar1 < 0x7b;
          }
        } while (local_2b);
        lex_unget_unsave(lex,iVar1);
        __s1 = strbuffer_value(&lex->saved_text);
        iVar1 = strcmp(__s1,"true");
        if (iVar1 == 0) {
          lex->token = 0x103;
        }
        else {
          iVar1 = strcmp(__s1,"false");
          if (iVar1 == 0) {
            lex->token = 0x104;
          }
          else {
            iVar1 = strcmp(__s1,"null");
            if (iVar1 == 0) {
              lex->token = 0x105;
            }
            else {
              lex->token = -1;
            }
          }
        }
      }
    }
    else {
      lex_scan_number(lex,iVar1,error);
    }
  }
  return lex->token;
}

Assistant:

static int lex_scan(lex_t *lex, json_error_t *error) {
    int c;

    strbuffer_clear(&lex->saved_text);

    if (lex->token == TOKEN_STRING)
        lex_free_string(lex);

    do
        c = lex_get(lex, error);
    while (c == ' ' || c == '\t' || c == '\n' || c == '\r');

    if (c == STREAM_STATE_EOF) {
        lex->token = TOKEN_EOF;
        goto out;
    }

    if (c == STREAM_STATE_ERROR) {
        lex->token = TOKEN_INVALID;
        goto out;
    }

    lex_save(lex, c);

    if (c == '{' || c == '}' || c == '[' || c == ']' || c == ':' || c == ',')
        lex->token = c;

    else if (c == '"')
        lex_scan_string(lex, error);

    else if (l_isdigit(c) || c == '-') {
        if (lex_scan_number(lex, c, error))
            goto out;
    } else if (l_isalpha(c)) {
        /* eat up the whole identifier for clearer error messages */
        const char *saved_text;

        do
            c = lex_get_save(lex, error);
        while (l_isalpha(c));
        lex_unget_unsave(lex, c);

        saved_text = strbuffer_value(&lex->saved_text);

        if (strcmp(saved_text, "true") == 0)
            lex->token = TOKEN_TRUE;
        else if (strcmp(saved_text, "false") == 0)
            lex->token = TOKEN_FALSE;
        else if (strcmp(saved_text, "null") == 0)
            lex->token = TOKEN_NULL;
        else
            lex->token = TOKEN_INVALID;
    } else {
        /* save the rest of the input UTF-8 sequence to get an error
           message of valid UTF-8 */
        lex_save_cached(lex);
        lex->token = TOKEN_INVALID;
    }

    out:
    return lex->token;
}